

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcfinal.c
# Opt level: O2

LispPTR arrayblockmerger(LispPTR base,LispPTR nbase)

{
  ushort uVar1;
  short sVar2;
  LispPTR LVar3;
  LispPTR *pLVar4;
  LispPTR *pLVar5;
  ushort uVar6;
  ushort length;
  ushort uVar7;
  ushort uVar8;
  
  pLVar4 = NativeAligned4FromLAddr(base);
  pLVar5 = NativeAligned4FromLAddr(nbase);
  uVar8 = (ushort)*pLVar4;
  uVar6 = (ushort)*pLVar5;
  uVar7 = ~uVar8;
  if (base + (uint)uVar8 * 2 != nbase) {
    error("Attempt to merge non-adjacent blocks in array space\n");
  }
  if (uVar7 < uVar6) {
    uVar6 = uVar6 - uVar7;
    uVar1 = 4;
    if (*Hunk_word == 0x4c) {
      uVar1 = 0x42;
    }
    sVar2 = uVar6 - uVar1;
    length = uVar1;
    if (uVar1 < uVar6) {
      length = uVar6;
    }
    uVar8 = sVar2 - 1;
    if (uVar1 <= uVar6) {
      sVar2 = 0;
      uVar8 = 0xffff;
    }
    LVar3 = nbase + (uint)(ushort)(sVar2 + uVar7) * 2;
    makefreearrayblock(LVar3,length);
    linkblock(LVar3);
    uVar6 = 0;
  }
  makefreearrayblock(base,uVar8 + uVar6);
  LVar3 = linkblock(base);
  return LVar3;
}

Assistant:

LispPTR arrayblockmerger(LispPTR base, LispPTR nbase) {
  DLword arlens, narlens, secondbite, minblocksize, shaveback;
  struct arrayblock *bbase, *bnbase;
  bbase = (struct arrayblock *)NativeAligned4FromLAddr(base);
  bnbase = (struct arrayblock *)NativeAligned4FromLAddr(nbase);
  arlens = bbase->arlen;
  narlens = bnbase->arlen;
  secondbite = MAXARRAYBLOCKSIZE - arlens;
  /* There are three cases for merging the blocks
   * (1) the total size of the two blocks is less than max:
   *     merge into a single block
   * (2) creating a max size block leaves a viable leftover block:
   *     move the boundary to make a max block and a leftover block
   * (3) creating a max size block leaves a non-viable leftover block
   *     move the boundary to make a big block and a minimum size leftover block
   */
  if (base + (2 * arlens) != nbase) {
    error("Attempt to merge non-adjacent blocks in array space\n");
  }
  if (narlens > secondbite) { /* (2) or (3) */
    arlens = MAXARRAYBLOCKSIZE;
    narlens = narlens - secondbite;
    minblocksize =
        ((*Hunk_word == ATOM_T) ? (ARRAYBLOCKOVERHEADCELLS + MAXCELLSPERHUNK) : MINARRAYBLOCKSIZE);
    if (narlens < minblocksize) { /* (3) */
      shaveback = narlens - minblocksize;
      narlens = minblocksize;
      arlens += shaveback;
      secondbite += shaveback;
    }
    linkblock(makefreearrayblock(nbase + 2 * secondbite, narlens));
    narlens = 0;
  }
  return (linkblock(makefreearrayblock(base, arlens + narlens)));
}